

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraint.cpp
# Opt level: O3

btScalar __thiscall
btMultiBodyConstraint::fillMultiBodyConstraint
          (btMultiBodyConstraint *this,btMultiBodySolverConstraint *solverConstraint,
          btMultiBodyJacobianData *data,btScalar *jacOrgA,btScalar *jacOrgB,
          btVector3 *contactNormalOnB,btVector3 *posAworld,btVector3 *posBworld,btScalar posError,
          btContactSolverInfo *infoGlobal,btScalar lowerLimit,btScalar upperLimit,
          btScalar relaxation,bool isFriction,btScalar desiredVelocity,btScalar cfmSlip)

{
  btScalar *pbVar1;
  float fVar2;
  undefined8 uVar3;
  int iVar4;
  btMultiBody *this_00;
  btMultiBody *this_01;
  btMultibodyLink *pbVar5;
  float *pfVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  btVector3 *pbVar13;
  uint uVar14;
  float *pfVar15;
  btSolverBody *pbVar16;
  ulong uVar17;
  btSolverBody *pbVar18;
  ulong uVar19;
  uint uVar20;
  btRigidBody *pbVar21;
  int iVar22;
  long lVar23;
  btRigidBody *pbVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  btScalar bVar31;
  btScalar bVar32;
  float fVar33;
  float fVar34;
  float local_d8;
  undefined8 local_b8;
  undefined8 local_a8;
  btVector3 local_58;
  btVector3 local_40;
  
  this_00 = this->m_bodyA;
  solverConstraint->m_multiBodyA = this_00;
  this_01 = this->m_bodyB;
  solverConstraint->m_multiBodyB = this_01;
  uVar20 = this->m_linkA;
  solverConstraint->m_linkA = uVar20;
  solverConstraint->m_linkB = this->m_linkB;
  if (this_00 == (btMultiBody *)0x0) {
    pbVar18 = data->m_solverBodyPool->m_data + solverConstraint->m_solverBodyIdA;
  }
  else {
    pbVar18 = (btSolverBody *)0x0;
  }
  if (this_01 == (btMultiBody *)0x0) {
    pbVar16 = data->m_solverBodyPool->m_data + solverConstraint->m_solverBodyIdB;
  }
  else {
    pbVar16 = (btSolverBody *)0x0;
  }
  if (this_00 == (btMultiBody *)0x0) {
    pbVar21 = pbVar18->m_originalBody;
  }
  else {
    pbVar21 = (btRigidBody *)0x0;
  }
  if (this_01 == (btMultiBody *)0x0) {
    pbVar24 = pbVar16->m_originalBody;
  }
  else {
    pbVar24 = (btRigidBody *)0x0;
  }
  fVar26 = desiredVelocity;
  if (pbVar18 != (btSolverBody *)0x0) {
    uVar3 = *(undefined8 *)(pbVar18->m_worldTransform).m_origin.m_floats;
    local_b8 = CONCAT44((float)((ulong)*(undefined8 *)posAworld->m_floats >> 0x20) -
                        (float)((ulong)uVar3 >> 0x20),
                        (float)*(undefined8 *)posAworld->m_floats - (float)uVar3);
    fVar26 = posAworld->m_floats[2] - (pbVar18->m_worldTransform).m_origin.m_floats[2];
  }
  if (pbVar16 != (btSolverBody *)0x0) {
    uVar3 = *(undefined8 *)(pbVar16->m_worldTransform).m_origin.m_floats;
    local_a8 = CONCAT44((float)((ulong)*(undefined8 *)posBworld->m_floats >> 0x20) -
                        (float)((ulong)uVar3 >> 0x20),
                        (float)*(undefined8 *)posBworld->m_floats - (float)uVar3);
    local_d8 = posBworld->m_floats[2] - (pbVar16->m_worldTransform).m_origin.m_floats[2];
  }
  if (this_00 == (btMultiBody *)0x0) {
    fVar27 = (float)*(undefined8 *)(contactNormalOnB->m_floats + 1);
    fVar29 = (float)((ulong)*(undefined8 *)(contactNormalOnB->m_floats + 1) >> 0x20);
    fVar30 = fVar29 * local_b8._4_4_ - fVar26 * fVar27;
    fVar29 = contactNormalOnB->m_floats[0] * fVar26 - (float)local_b8 * fVar29;
    fVar27 = fVar27 * (float)local_b8 - local_b8._4_4_ * contactNormalOnB->m_floats[0];
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar28 = 0.0;
    if (pbVar21 != (btRigidBody *)0x0) {
      uVar3 = *(undefined8 *)(pbVar21->m_angularFactor).m_floats;
      fVar33 = (float)uVar3 *
               (fVar27 * *(float *)&pbVar21->field_0x154 +
               fVar30 * *(float *)&(pbVar21->super_btCollisionObject).field_0x14c +
               *(float *)&pbVar21->field_0x150 * fVar29);
      fVar34 = (float)((ulong)uVar3 >> 0x20) *
               (fVar27 * *(float *)&pbVar21->field_0x164 +
               fVar30 * *(float *)&pbVar21->field_0x15c + *(float *)&pbVar21->field_0x160 * fVar29);
      fVar28 = (*(float *)&pbVar21->field_0x174 * fVar27 +
               *(float *)&pbVar21->field_0x16c * fVar30 + *(float *)&pbVar21->field_0x170 * fVar29)
               * (pbVar21->m_angularFactor).m_floats[2];
    }
    auVar11._4_4_ = fVar34;
    auVar11._0_4_ = fVar33;
    auVar11._8_4_ = fVar28;
    auVar11._12_4_ = 0;
    *(undefined1 (*) [16])(solverConstraint->m_angularComponentA).m_floats = auVar11;
    auVar10._4_4_ = fVar29;
    auVar10._0_4_ = fVar30;
    auVar10._8_4_ = fVar27;
    auVar10._12_4_ = 0;
    *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar10;
    uVar3 = *(undefined8 *)(contactNormalOnB->m_floats + 2);
    *(undefined8 *)(solverConstraint->m_contactNormal1).m_floats =
         *(undefined8 *)contactNormalOnB->m_floats;
    *(undefined8 *)((solverConstraint->m_contactNormal1).m_floats + 2) = uVar3;
  }
  else {
    if ((int)uVar20 < 0) {
      uVar3 = *(undefined8 *)(this_00->m_basePos).m_floats;
      local_b8 = CONCAT44((float)((ulong)*(undefined8 *)posAworld->m_floats >> 0x20) -
                          (float)((ulong)uVar3 >> 0x20),
                          (float)*(undefined8 *)posAworld->m_floats - (float)uVar3);
      pbVar13 = (btVector3 *)(this_00->m_basePos).m_floats;
    }
    else {
      pbVar5 = (this_00->m_links).m_data;
      pbVar13 = &pbVar5[uVar20].m_cachedWorldTransform.m_origin;
      uVar3 = *(undefined8 *)pbVar5[uVar20].m_cachedWorldTransform.m_origin.m_floats;
      local_b8 = CONCAT44((float)((ulong)*(undefined8 *)posAworld->m_floats >> 0x20) -
                          (float)((ulong)uVar3 >> 0x20),
                          (float)*(undefined8 *)posAworld->m_floats - (float)uVar3);
    }
    fVar26 = posAworld->m_floats[2] - pbVar13->m_floats[2];
    iVar22 = this_00->m_companionId;
    iVar4 = this_00->m_dofCount;
    uVar20 = iVar4 + 6;
    solverConstraint->m_deltaVelAindex = iVar22;
    if (iVar22 < 0) {
      uVar14 = (data->m_deltaVelocities).m_size;
      solverConstraint->m_deltaVelAindex = uVar14;
      this_00->m_companionId = uVar14;
      iVar22 = uVar14 + uVar20;
      if (-6 < iVar4) {
        lVar23 = (long)(int)uVar14;
        if ((data->m_deltaVelocities).m_capacity < iVar22) {
          if (iVar22 == 0) {
            pfVar15 = (float *)0x0;
          }
          else {
            pfVar15 = (float *)btAlignedAllocInternal((long)iVar22 * 4,0x10);
            uVar14 = (data->m_deltaVelocities).m_size;
          }
          pfVar6 = (data->m_deltaVelocities).m_data;
          if ((int)uVar14 < 1) {
            if (pfVar6 != (float *)0x0) goto LAB_001c826f;
          }
          else {
            uVar17 = 0;
            do {
              pfVar15[uVar17] = pfVar6[uVar17];
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
LAB_001c826f:
            if ((data->m_deltaVelocities).m_ownsMemory == true) {
              btAlignedFreeInternal(pfVar6);
            }
          }
          (data->m_deltaVelocities).m_ownsMemory = true;
          (data->m_deltaVelocities).m_data = pfVar15;
          (data->m_deltaVelocities).m_capacity = iVar22;
        }
        else {
          pfVar15 = (data->m_deltaVelocities).m_data;
        }
        memset(pfVar15 + lVar23,0,(iVar22 - lVar23) * 4);
      }
      (data->m_deltaVelocities).m_size = iVar22;
    }
    uVar14 = (data->m_jacobians).m_size;
    solverConstraint->m_jacAindex = uVar14;
    iVar22 = uVar14 + uVar20;
    if (iVar4 < -5) {
      (data->m_jacobians).m_size = iVar22;
      if (jacOrgA == (btScalar *)0x0) goto LAB_001c83e9;
LAB_001c83d6:
      iVar22 = uVar20 + (data->m_deltaVelocitiesUnitImpulse).m_size;
LAB_001c8489:
      pfVar15 = (data->m_deltaVelocitiesUnitImpulse).m_data;
    }
    else {
      lVar23 = (long)(int)uVar14;
      if ((data->m_jacobians).m_capacity < iVar22) {
        if (iVar22 == 0) {
          pfVar15 = (float *)0x0;
        }
        else {
          pfVar15 = (float *)btAlignedAllocInternal((long)iVar22 * 4,0x10);
          uVar14 = (data->m_jacobians).m_size;
        }
        pfVar6 = (data->m_jacobians).m_data;
        if ((int)uVar14 < 1) {
          if (pfVar6 != (float *)0x0) goto LAB_001c8345;
        }
        else {
          uVar17 = 0;
          do {
            pfVar15[uVar17] = pfVar6[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
LAB_001c8345:
          if ((data->m_jacobians).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar6);
          }
        }
        (data->m_jacobians).m_ownsMemory = true;
        (data->m_jacobians).m_data = pfVar15;
        (data->m_jacobians).m_capacity = iVar22;
      }
      else {
        pfVar15 = (data->m_jacobians).m_data;
      }
      memset(pfVar15 + lVar23,0,(iVar22 - lVar23) * 4);
      (data->m_jacobians).m_size = iVar22;
      if (jacOrgA == (btScalar *)0x0) {
LAB_001c83e9:
        local_58.m_floats[0] = 0.0;
        local_58.m_floats[1] = 0.0;
        local_58.m_floats[2] = 0.0;
        local_58.m_floats[3] = 0.0;
        btMultiBody::fillConstraintJacobianMultiDof
                  (this_00,solverConstraint->m_linkA,posAworld,&local_58,contactNormalOnB,
                   (data->m_jacobians).m_data + solverConstraint->m_jacAindex,&data->scratch_r,
                   &data->scratch_v,&data->scratch_m);
      }
      else {
        if (iVar4 < -5) goto LAB_001c83d6;
        iVar22 = solverConstraint->m_jacAindex;
        uVar17 = 1;
        if (1 < (int)uVar20) {
          uVar17 = (ulong)uVar20;
        }
        pfVar15 = (data->m_jacobians).m_data;
        uVar19 = 0;
        do {
          pfVar15[(long)iVar22 + uVar19] = jacOrgA[uVar19];
          uVar19 = uVar19 + 1;
        } while (uVar17 != uVar19);
      }
      uVar14 = (data->m_deltaVelocitiesUnitImpulse).m_size;
      iVar22 = uVar20 + uVar14;
      if (iVar4 < -5) goto LAB_001c8489;
      lVar23 = (long)(int)uVar14;
      if ((data->m_deltaVelocitiesUnitImpulse).m_capacity < iVar22) {
        if (iVar22 == 0) {
          pfVar15 = (float *)0x0;
        }
        else {
          pfVar15 = (float *)btAlignedAllocInternal((long)iVar22 * 4,0x10);
          uVar14 = (data->m_deltaVelocitiesUnitImpulse).m_size;
        }
        pfVar6 = (data->m_deltaVelocitiesUnitImpulse).m_data;
        if ((int)uVar14 < 1) {
          if (pfVar6 != (float *)0x0) goto LAB_001c84c0;
        }
        else {
          uVar17 = 0;
          do {
            pfVar15[uVar17] = pfVar6[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
LAB_001c84c0:
          if ((data->m_deltaVelocitiesUnitImpulse).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar6);
          }
        }
        (data->m_deltaVelocitiesUnitImpulse).m_ownsMemory = true;
        (data->m_deltaVelocitiesUnitImpulse).m_data = pfVar15;
        (data->m_deltaVelocitiesUnitImpulse).m_capacity = iVar22;
      }
      else {
        pfVar15 = (data->m_deltaVelocitiesUnitImpulse).m_data;
      }
      memset(pfVar15 + lVar23,0,(iVar22 - lVar23) * 4);
    }
    (data->m_deltaVelocitiesUnitImpulse).m_size = iVar22;
    btMultiBody::calcAccelerationDeltasMultiDof
              (this_00,(data->m_jacobians).m_data + solverConstraint->m_jacAindex,
               pfVar15 + solverConstraint->m_jacAindex,&data->scratch_r,&data->scratch_v);
    fVar27 = (float)*(undefined8 *)(contactNormalOnB->m_floats + 1);
    fVar29 = (float)((ulong)*(undefined8 *)(contactNormalOnB->m_floats + 1) >> 0x20);
    auVar8._4_4_ = contactNormalOnB->m_floats[0] * fVar26 - (float)local_b8 * fVar29;
    auVar8._0_4_ = fVar29 * local_b8._4_4_ - fVar26 * fVar27;
    auVar8._8_4_ = fVar27 * (float)local_b8 - local_b8._4_4_ * contactNormalOnB->m_floats[0];
    auVar8._12_4_ = 0;
    *(undefined1 (*) [16])(solverConstraint->m_relpos1CrossNormal).m_floats = auVar8;
    uVar3 = *(undefined8 *)(contactNormalOnB->m_floats + 2);
    *(undefined8 *)(solverConstraint->m_contactNormal1).m_floats =
         *(undefined8 *)contactNormalOnB->m_floats;
    *(undefined8 *)((solverConstraint->m_contactNormal1).m_floats + 2) = uVar3;
  }
  if (this_01 == (btMultiBody *)0x0) {
    fVar29 = (float)*(undefined8 *)contactNormalOnB->m_floats;
    fVar28 = (float)((ulong)*(undefined8 *)contactNormalOnB->m_floats >> 0x20);
    fVar30 = local_a8._4_4_ * contactNormalOnB->m_floats[2] - fVar28 * local_d8;
    fVar27 = local_d8 * fVar29 - contactNormalOnB->m_floats[2] * (float)local_a8;
    fVar29 = (float)local_a8 * fVar28 - fVar29 * local_a8._4_4_;
    if (pbVar24 == (btRigidBody *)0x0) {
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar28 = 0.0;
    }
    else {
      uVar3 = *(undefined8 *)(pbVar24->m_angularFactor).m_floats;
      fVar33 = (float)uVar3 *
               ((-fVar30 * *(float *)&(pbVar24->super_btCollisionObject).field_0x14c -
                fVar27 * *(float *)&pbVar24->field_0x150) - fVar29 * *(float *)&pbVar24->field_0x154
               );
      fVar34 = (float)((ulong)uVar3 >> 0x20) *
               ((-fVar30 * *(float *)&pbVar24->field_0x15c -
                fVar27 * *(float *)&pbVar24->field_0x160) - fVar29 * *(float *)&pbVar24->field_0x164
               );
      fVar28 = (-fVar29 * *(float *)&pbVar24->field_0x174 +
               (*(float *)&pbVar24->field_0x170 * -fVar27 - fVar30 * *(float *)&pbVar24->field_0x16c
               )) * (pbVar24->m_angularFactor).m_floats[2];
    }
    auVar12._4_4_ = fVar34;
    auVar12._0_4_ = fVar33;
    auVar12._8_4_ = fVar28;
    auVar12._12_4_ = 0;
    *(undefined1 (*) [16])(solverConstraint->m_angularComponentB).m_floats = auVar12;
    goto LAB_001c8b4c;
  }
  lVar23 = (long)solverConstraint->m_linkB;
  if (lVar23 < 0) {
    uVar3 = *(undefined8 *)(this_01->m_basePos).m_floats;
    local_a8 = CONCAT44((float)((ulong)*(undefined8 *)posBworld->m_floats >> 0x20) -
                        (float)((ulong)uVar3 >> 0x20),
                        (float)*(undefined8 *)posBworld->m_floats - (float)uVar3);
    pbVar13 = (btVector3 *)(this_01->m_basePos).m_floats;
  }
  else {
    pbVar5 = (this_01->m_links).m_data;
    pbVar13 = &pbVar5[lVar23].m_cachedWorldTransform.m_origin;
    uVar3 = *(undefined8 *)pbVar5[lVar23].m_cachedWorldTransform.m_origin.m_floats;
    local_a8 = CONCAT44((float)((ulong)*(undefined8 *)posBworld->m_floats >> 0x20) -
                        (float)((ulong)uVar3 >> 0x20),
                        (float)*(undefined8 *)posBworld->m_floats - (float)uVar3);
  }
  local_d8 = posBworld->m_floats[2] - pbVar13->m_floats[2];
  iVar22 = this_01->m_companionId;
  iVar4 = this_01->m_dofCount;
  uVar20 = iVar4 + 6;
  solverConstraint->m_deltaVelBindex = iVar22;
  if (iVar22 < 0) {
    uVar14 = (data->m_deltaVelocities).m_size;
    solverConstraint->m_deltaVelBindex = uVar14;
    this_01->m_companionId = uVar14;
    iVar22 = uVar14 + uVar20;
    if (-6 < iVar4) {
      lVar23 = (long)(int)uVar14;
      if ((data->m_deltaVelocities).m_capacity < iVar22) {
        if (iVar22 == 0) {
          pfVar15 = (float *)0x0;
        }
        else {
          pfVar15 = (float *)btAlignedAllocInternal((long)iVar22 * 4,0x10);
          uVar14 = (data->m_deltaVelocities).m_size;
        }
        pfVar6 = (data->m_deltaVelocities).m_data;
        if ((int)uVar14 < 1) {
          if (pfVar6 != (float *)0x0) goto LAB_001c87e9;
        }
        else {
          uVar17 = 0;
          do {
            pfVar15[uVar17] = pfVar6[uVar17];
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
LAB_001c87e9:
          if ((data->m_deltaVelocities).m_ownsMemory == true) {
            btAlignedFreeInternal(pfVar6);
          }
        }
        (data->m_deltaVelocities).m_ownsMemory = true;
        (data->m_deltaVelocities).m_data = pfVar15;
        (data->m_deltaVelocities).m_capacity = iVar22;
      }
      else {
        pfVar15 = (data->m_deltaVelocities).m_data;
      }
      memset(pfVar15 + lVar23,0,(iVar22 - lVar23) * 4);
    }
    (data->m_deltaVelocities).m_size = iVar22;
  }
  uVar14 = (data->m_jacobians).m_size;
  solverConstraint->m_jacBindex = uVar14;
  iVar22 = uVar14 + uVar20;
  if (iVar4 < -5) {
    (data->m_jacobians).m_size = iVar22;
    if (jacOrgB == (btScalar *)0x0) goto LAB_001c897d;
LAB_001c8974:
    iVar22 = uVar20 + (data->m_deltaVelocitiesUnitImpulse).m_size;
LAB_001c8a30:
    pfVar15 = (data->m_deltaVelocitiesUnitImpulse).m_data;
  }
  else {
    lVar23 = (long)(int)uVar14;
    if ((data->m_jacobians).m_capacity < iVar22) {
      if (iVar22 == 0) {
        pfVar15 = (float *)0x0;
      }
      else {
        pfVar15 = (float *)btAlignedAllocInternal((long)iVar22 * 4,0x10);
        uVar14 = (data->m_jacobians).m_size;
      }
      pfVar6 = (data->m_jacobians).m_data;
      if ((int)uVar14 < 1) {
        if (pfVar6 != (float *)0x0) goto LAB_001c88d7;
      }
      else {
        uVar17 = 0;
        do {
          pfVar15[uVar17] = pfVar6[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
LAB_001c88d7:
        if ((data->m_jacobians).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar6);
        }
      }
      (data->m_jacobians).m_ownsMemory = true;
      (data->m_jacobians).m_data = pfVar15;
      (data->m_jacobians).m_capacity = iVar22;
    }
    else {
      pfVar15 = (data->m_jacobians).m_data;
    }
    memset(pfVar15 + lVar23,0,(iVar22 - lVar23) * 4);
    (data->m_jacobians).m_size = iVar22;
    if (jacOrgB == (btScalar *)0x0) {
LAB_001c897d:
      uVar17 = *(ulong *)contactNormalOnB->m_floats ^ 0x8000000080000000;
      local_40.m_floats[2] = -contactNormalOnB->m_floats[2];
      local_40.m_floats[0] = (btScalar)(int)uVar17;
      local_40.m_floats[1] = (btScalar)(int)(uVar17 >> 0x20);
      local_40.m_floats[3] = 0.0;
      local_58.m_floats[0] = 0.0;
      local_58.m_floats[1] = 0.0;
      local_58.m_floats[2] = 0.0;
      local_58.m_floats[3] = 0.0;
      btMultiBody::fillConstraintJacobianMultiDof
                (this_01,solverConstraint->m_linkB,posBworld,&local_58,&local_40,
                 (data->m_jacobians).m_data + solverConstraint->m_jacBindex,&data->scratch_r,
                 &data->scratch_v,&data->scratch_m);
    }
    else {
      if (iVar4 < -5) goto LAB_001c8974;
      iVar22 = solverConstraint->m_jacBindex;
      uVar17 = 1;
      if (1 < (int)uVar20) {
        uVar17 = (ulong)uVar20;
      }
      pfVar15 = (data->m_jacobians).m_data;
      uVar19 = 0;
      do {
        pfVar15[(long)iVar22 + uVar19] = jacOrgB[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar17 != uVar19);
    }
    uVar14 = (data->m_deltaVelocitiesUnitImpulse).m_size;
    iVar22 = uVar20 + uVar14;
    if (iVar4 < -5) goto LAB_001c8a30;
    lVar23 = (long)(int)uVar14;
    if ((data->m_deltaVelocitiesUnitImpulse).m_capacity < iVar22) {
      if (iVar22 == 0) {
        pfVar15 = (float *)0x0;
      }
      else {
        pfVar15 = (float *)btAlignedAllocInternal((long)iVar22 * 4,0x10);
        uVar14 = (data->m_deltaVelocitiesUnitImpulse).m_size;
      }
      pfVar6 = (data->m_deltaVelocitiesUnitImpulse).m_data;
      if ((int)uVar14 < 1) {
        if (pfVar6 != (float *)0x0) goto LAB_001c8a64;
      }
      else {
        uVar17 = 0;
        do {
          pfVar15[uVar17] = pfVar6[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
LAB_001c8a64:
        if ((data->m_deltaVelocitiesUnitImpulse).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar6);
        }
      }
      (data->m_deltaVelocitiesUnitImpulse).m_ownsMemory = true;
      (data->m_deltaVelocitiesUnitImpulse).m_data = pfVar15;
      (data->m_deltaVelocitiesUnitImpulse).m_capacity = iVar22;
    }
    else {
      pfVar15 = (data->m_deltaVelocitiesUnitImpulse).m_data;
    }
    memset(pfVar15 + lVar23,0,(iVar22 - lVar23) * 4);
  }
  (data->m_deltaVelocitiesUnitImpulse).m_size = iVar22;
  btMultiBody::calcAccelerationDeltasMultiDof
            (this_01,(data->m_jacobians).m_data + solverConstraint->m_jacBindex,
             pfVar15 + solverConstraint->m_jacBindex,&data->scratch_r,&data->scratch_v);
  fVar29 = (float)*(undefined8 *)contactNormalOnB->m_floats;
  fVar28 = (float)((ulong)*(undefined8 *)contactNormalOnB->m_floats >> 0x20);
  fVar30 = local_a8._4_4_ * contactNormalOnB->m_floats[2] - fVar28 * local_d8;
  fVar27 = local_d8 * fVar29 - contactNormalOnB->m_floats[2] * (float)local_a8;
  fVar29 = (float)local_a8 * fVar28 - fVar29 * local_a8._4_4_;
LAB_001c8b4c:
  auVar9._8_4_ = -fVar29;
  auVar9._0_8_ = CONCAT44(fVar27,fVar30) ^ 0x8000000080000000;
  auVar9._12_4_ = 0;
  *(undefined1 (*) [16])(solverConstraint->m_relpos2CrossNormal).m_floats = auVar9;
  fVar27 = contactNormalOnB->m_floats[0];
  fVar29 = contactNormalOnB->m_floats[1];
  fVar30 = contactNormalOnB->m_floats[2];
  auVar7._8_4_ = -fVar30;
  auVar7._0_8_ = *(ulong *)contactNormalOnB->m_floats ^ 0x8000000080000000;
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])(solverConstraint->m_contactNormal2).m_floats = auVar7;
  if (this_00 == (btMultiBody *)0x0) {
    if (pbVar21 == (btRigidBody *)0x0) {
      fVar28 = 0.0;
    }
    else {
      fVar28 = (solverConstraint->m_angularComponentA).m_floats[0];
      fVar33 = (solverConstraint->m_angularComponentA).m_floats[1];
      fVar34 = (solverConstraint->m_angularComponentA).m_floats[2];
      fVar28 = (local_b8._4_4_ * fVar28 - (float)local_b8 * fVar33) * contactNormalOnB->m_floats[2]
               + (fVar33 * fVar26 - local_b8._4_4_ * fVar34) * contactNormalOnB->m_floats[0] +
                 (fVar34 * (float)local_b8 - fVar26 * fVar28) * contactNormalOnB->m_floats[1] +
               pbVar21->m_inverseMass;
    }
  }
  else {
    fVar28 = 0.0;
    if (-6 < this_00->m_dofCount) {
      iVar22 = this_00->m_dofCount + 5;
      uVar17 = 0;
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      do {
        fVar28 = fVar28 + (data->m_jacobians).m_data[(long)solverConstraint->m_jacAindex + uVar17] *
                          (data->m_deltaVelocitiesUnitImpulse).m_data
                          [(long)solverConstraint->m_jacAindex + uVar17];
        uVar17 = uVar17 + 1;
      } while (iVar22 + 1 != uVar17);
    }
  }
  if (this_01 == (btMultiBody *)0x0) {
    if (pbVar24 == (btRigidBody *)0x0) {
      fVar33 = 0.0;
    }
    else {
      fVar33 = (solverConstraint->m_angularComponentB).m_floats[0];
      fVar34 = (solverConstraint->m_angularComponentB).m_floats[1];
      fVar2 = (solverConstraint->m_angularComponentB).m_floats[2];
      fVar33 = ((float)local_a8 * fVar34 - local_a8._4_4_ * fVar33) * contactNormalOnB->m_floats[2]
               + (local_a8._4_4_ * fVar2 - fVar34 * local_d8) * contactNormalOnB->m_floats[0] +
                 (local_d8 * fVar33 - fVar2 * (float)local_a8) * contactNormalOnB->m_floats[1] +
               pbVar24->m_inverseMass;
    }
  }
  else {
    fVar33 = 0.0;
    if (-6 < this_01->m_dofCount) {
      iVar22 = this_01->m_dofCount + 5;
      uVar17 = 0;
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      do {
        fVar33 = fVar33 + (data->m_jacobians).m_data[(long)solverConstraint->m_jacBindex + uVar17] *
                          (data->m_deltaVelocitiesUnitImpulse).m_data
                          [(long)solverConstraint->m_jacBindex + uVar17];
        uVar17 = uVar17 + 1;
      } while (iVar22 + 1 != uVar17);
    }
  }
  fVar28 = (float)(-(uint)(1.1920929e-07 < fVar28 + fVar33) & (uint)(relaxation / (fVar28 + fVar33))
                  );
  solverConstraint->m_jacDiagABInv = fVar28;
  if (this_00 == (btMultiBody *)0x0) {
    if (pbVar21 == (btRigidBody *)0x0) {
      fVar26 = 0.0;
    }
    else {
      fVar33 = (pbVar21->m_angularVelocity).m_floats[0];
      fVar34 = (pbVar21->m_angularVelocity).m_floats[1];
      fVar2 = (pbVar21->m_angularVelocity).m_floats[2];
      fVar26 = ((local_b8._4_4_ * fVar33 - (float)local_b8 * fVar34) +
               (pbVar21->m_linearVelocity).m_floats[2]) *
               (solverConstraint->m_contactNormal1).m_floats[2] +
               ((fVar34 * fVar26 - local_b8._4_4_ * fVar2) + (pbVar21->m_linearVelocity).m_floats[0]
               ) * (solverConstraint->m_contactNormal1).m_floats[0] +
               ((fVar2 * (float)local_b8 - fVar26 * fVar33) +
               (pbVar21->m_linearVelocity).m_floats[1]) *
               (solverConstraint->m_contactNormal1).m_floats[1] + 0.0;
    }
  }
  else {
    fVar26 = 0.0;
    if (-6 < this_00->m_dofCount) {
      iVar22 = this_00->m_dofCount + 5;
      uVar17 = 0;
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      do {
        fVar26 = fVar26 + (this_00->m_realBuf).m_data[uVar17] *
                          (data->m_jacobians).m_data[(long)solverConstraint->m_jacAindex + uVar17];
        uVar17 = uVar17 + 1;
      } while (iVar22 + 1 != uVar17);
    }
  }
  if (this_01 == (btMultiBody *)0x0) {
    if (pbVar24 != (btRigidBody *)0x0) {
      fVar33 = (pbVar24->m_angularVelocity).m_floats[0];
      fVar34 = (pbVar24->m_angularVelocity).m_floats[1];
      fVar2 = (pbVar24->m_angularVelocity).m_floats[2];
      fVar26 = fVar26 + ((local_a8._4_4_ * fVar33 - (float)local_a8 * fVar34) +
                        (pbVar24->m_linearVelocity).m_floats[2]) * -fVar30 +
                        ((fVar34 * local_d8 - local_a8._4_4_ * fVar2) +
                        (pbVar24->m_linearVelocity).m_floats[0]) * -fVar27 +
                        ((fVar2 * (float)local_a8 - local_d8 * fVar33) +
                        (pbVar24->m_linearVelocity).m_floats[1]) * -fVar29;
    }
  }
  else if (-6 < this_01->m_dofCount) {
    iVar22 = this_01->m_dofCount + 5;
    uVar17 = 0;
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    do {
      fVar26 = fVar26 + (this_01->m_realBuf).m_data[uVar17] *
                        (data->m_jacobians).m_data[(long)solverConstraint->m_jacBindex + uVar17];
      uVar17 = uVar17 + 1;
    } while (iVar22 + 1 != uVar17);
  }
  fVar27 = 0.0;
  if (!isFriction) {
    fVar27 = posError + (infoGlobal->super_btContactSolverInfoData).m_linearSlop;
  }
  solverConstraint->m_friction = 0.0;
  solverConstraint->m_appliedPushImpulse = 0.0;
  solverConstraint->m_appliedImpulse = 0.0;
  bVar25 = (infoGlobal->super_btContactSolverInfoData).m_splitImpulse == 0;
  pbVar1 = &(infoGlobal->super_btContactSolverInfoData).m_splitImpulsePenetrationThreshold;
  bVar32 = ((-fVar27 *
            (&(infoGlobal->super_btContactSolverInfoData).m_erp)
            [((NAN(fVar27) || NAN(*pbVar1)) || (*pbVar1 > fVar27 || fVar27 == *pbVar1)) && !bVar25])
           / (infoGlobal->super_btContactSolverInfoData).m_timeStep) * fVar28;
  bVar31 = (desiredVelocity - fVar26) * fVar28;
  if (*pbVar1 <= fVar27 && fVar27 != *pbVar1 || bVar25) {
    bVar31 = bVar31 + bVar32;
    bVar32 = 0.0;
  }
  solverConstraint->m_rhs = bVar31;
  solverConstraint->m_rhsPenetration = bVar32;
  solverConstraint->m_cfm = 0.0;
  solverConstraint->m_lowerLimit = lowerLimit;
  solverConstraint->m_upperLimit = upperLimit;
  return fVar26;
}

Assistant:

btScalar btMultiBodyConstraint::fillMultiBodyConstraint(	btMultiBodySolverConstraint& solverConstraint,
															btMultiBodyJacobianData& data,
															btScalar* jacOrgA, btScalar* jacOrgB,
															const btVector3& contactNormalOnB,
															const btVector3& posAworld, const btVector3& posBworld,
															btScalar posError,
															const btContactSolverInfo& infoGlobal,
															btScalar lowerLimit, btScalar upperLimit,
															btScalar relaxation,
															bool isFriction, btScalar desiredVelocity, btScalar cfmSlip)
{


	solverConstraint.m_multiBodyA = m_bodyA;
	solverConstraint.m_multiBodyB = m_bodyB;
	solverConstraint.m_linkA = m_linkA;
	solverConstraint.m_linkB = m_linkB;

	btMultiBody* multiBodyA = solverConstraint.m_multiBodyA;
	btMultiBody* multiBodyB = solverConstraint.m_multiBodyB;

	btSolverBody* bodyA = multiBodyA ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdA);
	btSolverBody* bodyB = multiBodyB ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdB);

	btRigidBody* rb0 = multiBodyA ? 0 : bodyA->m_originalBody;
	btRigidBody* rb1 = multiBodyB ? 0 : bodyB->m_originalBody;

	btVector3 rel_pos1, rel_pos2;				//these two used to be inited to posAworld and posBworld (respectively) but it does not seem necessary
	if (bodyA)
		rel_pos1 = posAworld - bodyA->getWorldTransform().getOrigin();
	if (bodyB)
		rel_pos2 = posBworld - bodyB->getWorldTransform().getOrigin();

	if (multiBodyA)
	{
		if (solverConstraint.m_linkA<0)
		{
			rel_pos1 = posAworld - multiBodyA->getBasePos();
		} else
		{
			rel_pos1 = posAworld - multiBodyA->getLink(solverConstraint.m_linkA).m_cachedWorldTransform.getOrigin();
		}

		const int ndofA  = multiBodyA->getNumDofs() + 6;

		solverConstraint.m_deltaVelAindex = multiBodyA->getCompanionId();

		if (solverConstraint.m_deltaVelAindex <0)
		{
			solverConstraint.m_deltaVelAindex = data.m_deltaVelocities.size();
			multiBodyA->setCompanionId(solverConstraint.m_deltaVelAindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofA);
		} else
		{
			btAssert(data.m_deltaVelocities.size() >= solverConstraint.m_deltaVelAindex+ndofA);
		}

		//determine jacobian of this 1D constraint in terms of multibodyA's degrees of freedom
		//resize..
		solverConstraint.m_jacAindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofA);
		//copy/determine
		if(jacOrgA)
		{
			for (int i=0;i<ndofA;i++)
				data.m_jacobians[solverConstraint.m_jacAindex+i] = jacOrgA[i];
		}
		else
		{
			btScalar* jac1=&data.m_jacobians[solverConstraint.m_jacAindex];
			multiBodyA->fillContactJacobianMultiDof(solverConstraint.m_linkA, posAworld, contactNormalOnB, jac1, data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine the velocity response of multibodyA to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofA);		//=> each constraint row has the constrained tree dofs allocated in m_deltaVelocitiesUnitImpulse
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
		//determine..
		multiBodyA->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacAindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}
	else //if(rb0)
	{
		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_angularComponentA = rb0 ? rb0->getInvInertiaTensorWorld()*torqueAxis0*rb0->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}

	if (multiBodyB)
	{
		if (solverConstraint.m_linkB<0)
		{
			rel_pos2 = posBworld - multiBodyB->getBasePos();
		} else
		{
			rel_pos2 = posBworld - multiBodyB->getLink(solverConstraint.m_linkB).m_cachedWorldTransform.getOrigin();
		}

		const int ndofB  = multiBodyB->getNumDofs() + 6;

		solverConstraint.m_deltaVelBindex = multiBodyB->getCompanionId();
		if (solverConstraint.m_deltaVelBindex <0)
		{
			solverConstraint.m_deltaVelBindex = data.m_deltaVelocities.size();
			multiBodyB->setCompanionId(solverConstraint.m_deltaVelBindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofB);
		}

		//determine jacobian of this 1D constraint in terms of multibodyB's degrees of freedom
		//resize..
		solverConstraint.m_jacBindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofB);
		//copy/determine..
		if(jacOrgB)
		{
			for (int i=0;i<ndofB;i++)
				data.m_jacobians[solverConstraint.m_jacBindex+i] = jacOrgB[i];
		}
		else
		{
			multiBodyB->fillContactJacobianMultiDof(solverConstraint.m_linkB, posBworld, -contactNormalOnB, &data.m_jacobians[solverConstraint.m_jacBindex], data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine velocity response of multibodyB to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofB);
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
		//determine..
		multiBodyB->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacBindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;

	}
	else //if(rb1)
	{
		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_angularComponentB = rb1 ? rb1->getInvInertiaTensorWorld()*-torqueAxis1*rb1->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;
	}
	{

		btVector3 vec;
		btScalar denom0 = 0.f;
		btScalar denom1 = 0.f;
		btScalar* jacB = 0;
		btScalar* jacA = 0;
		btScalar* deltaVelA = 0;
		btScalar* deltaVelB = 0;
		int ndofA  = 0;
		//determine the "effective mass" of the constrained multibodyA with respect to this 1D constraint (i.e. 1/A[i,i])
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			deltaVelA = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA; ++i)
			{
				btScalar j = jacA[i] ;
				btScalar l = deltaVelA[i];
				denom0 += j*l;
			}
		}
		else if(rb0)
		{
			vec = ( solverConstraint.m_angularComponentA).cross(rel_pos1);
			denom0 = rb0->getInvMass() + contactNormalOnB.dot(vec);
		}
		//
		if (multiBodyB)
		{
			const int ndofB = multiBodyB->getNumDofs() + 6;
			jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			deltaVelB = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB; ++i)
			{
				btScalar j = jacB[i] ;
				btScalar l = deltaVelB[i];
				denom1 += j*l;
			}

		}
		else if(rb1)
		{
			vec = ( -solverConstraint.m_angularComponentB).cross(rel_pos2);
			denom1 = rb1->getInvMass() + contactNormalOnB.dot(vec);
		}

		//
		btScalar d = denom0+denom1;
		if (d>SIMD_EPSILON)
		{
			solverConstraint.m_jacDiagABInv = relaxation/(d);
		}
		else
		{
		//disable the constraint row to handle singularity/redundant constraint
			solverConstraint.m_jacDiagABInv  = 0.f;
		}
	}


	//compute rhs and remaining solverConstraint fields
	btScalar penetration = isFriction? 0 : posError+infoGlobal.m_linearSlop;

	btScalar rel_vel = 0.f;
	int ndofA  = 0;
	int ndofB  = 0;
	{
		btVector3 vel1,vel2;
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			btScalar* jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA ; ++i)
				rel_vel += multiBodyA->getVelocityVector()[i] * jacA[i];
		}
		else if(rb0)
		{
			rel_vel += rb0->getVelocityInLocalPoint(rel_pos1).dot(solverConstraint.m_contactNormal1);
		}
		if (multiBodyB)
		{
			ndofB = multiBodyB->getNumDofs() + 6;
			btScalar* jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB ; ++i)
				rel_vel += multiBodyB->getVelocityVector()[i] * jacB[i];

		}
		else if(rb1)
		{
			rel_vel += rb1->getVelocityInLocalPoint(rel_pos2).dot(solverConstraint.m_contactNormal2);
		}

		solverConstraint.m_friction = 0.f;//cp.m_combinedFriction;
	}


	///warm starting (or zero if disabled)
	/*
	if (infoGlobal.m_solverMode & SOLVER_USE_WARMSTARTING)
	{
		solverConstraint.m_appliedImpulse = isFriction ? 0 : cp.m_appliedImpulse * infoGlobal.m_warmstartingFactor;

		if (solverConstraint.m_appliedImpulse)
		{
			if (multiBodyA)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
				multiBodyA->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelAindex,ndofA);
			} else
			{
				if (rb0)
					bodyA->internalApplyImpulse(solverConstraint.m_contactNormal1*bodyA->internalGetInvMass()*rb0->getLinearFactor(),solverConstraint.m_angularComponentA,solverConstraint.m_appliedImpulse);
			}
			if (multiBodyB)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
				multiBodyB->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelBindex,ndofB);
			} else
			{
				if (rb1)
					bodyB->internalApplyImpulse(-solverConstraint.m_contactNormal2*bodyB->internalGetInvMass()*rb1->getLinearFactor(),-solverConstraint.m_angularComponentB,-(btScalar)solverConstraint.m_appliedImpulse);
			}
		}
	} else
	*/

	solverConstraint.m_appliedImpulse = 0.f;
	solverConstraint.m_appliedPushImpulse = 0.f;

	{

		btScalar positionalError = 0.f;
		btScalar	velocityError = desiredVelocity - rel_vel;// * damping;


		btScalar erp = infoGlobal.m_erp2;
		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			erp = infoGlobal.m_erp;
		}

		positionalError = -penetration * erp/infoGlobal.m_timeStep;

		btScalar  penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
		btScalar velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;

		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			//combine position and velocity into rhs
			solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
			solverConstraint.m_rhsPenetration = 0.f;

		} else
		{
			//split position and velocity into rhs and m_rhsPenetration
			solverConstraint.m_rhs = velocityImpulse;
			solverConstraint.m_rhsPenetration = penetrationImpulse;
		}

		solverConstraint.m_cfm = 0.f;
		solverConstraint.m_lowerLimit = lowerLimit;
		solverConstraint.m_upperLimit = upperLimit;
	}

	return rel_vel;

}